

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

bool __thiscall
ylt::detail::moodycamel::
ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
::
inner_enqueue<(ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0,std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>>
          (ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
           *this,unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                 *element)

{
  ImplicitProducer *pIVar1;
  ImplicitProducer *producer;
  unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
  *in_stack_00000030;
  ImplicitProducer *in_stack_00000038;
  ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
  *in_stack_00000318;
  undefined1 local_19;
  
  pIVar1 = ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
           ::get_or_add_implicit_producer(in_stack_00000318);
  if (pIVar1 == (ImplicitProducer *)0x0) {
    local_19 = false;
  }
  else {
    local_19 = ImplicitProducer::
               enqueue<(ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0,std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>>
                         (in_stack_00000038,in_stack_00000030);
  }
  return local_19;
}

Assistant:

inline bool inner_enqueue(U&& element) {
    auto producer = get_or_add_implicit_producer();
    return producer == nullptr
               ? false
               : producer->ConcurrentQueue::ImplicitProducer::template enqueue<
                     canAlloc>(std::forward<U>(element));
  }